

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_circular_deque.h
# Opt level: O2

void __thiscall
quic::
QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
::
AssignRange<quic::QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>::basic_iterator<quic::BandwidthSampler::AckPoint_const>,void>
          (QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
           *this,basic_iterator<const_quic::BandwidthSampler::AckPoint> first,
          basic_iterator<const_quic::BandwidthSampler::AckPoint> last)

{
  size_type new_cap;
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  *pQVar1;
  size_type sVar2;
  bool bVar3;
  
  pQVar1 = first.deque_;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  new_cap = std::
            __distance<quic::QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>::basic_iterator<quic::BandwidthSampler::AckPoint_const>>
                      (pQVar1,first.index_,last.deque_,last.index_);
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  ::reserve((QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
             *)this,new_cap);
  sVar2 = first.index_;
  while (sVar2 != last.index_) {
    emplace_back<quic::BandwidthSampler::AckPoint_const&>
              (this,(pQVar1->allocator_and_data_).data + sVar2);
    bVar3 = (pQVar1->allocator_and_data_).data_capacity - 1 == sVar2;
    sVar2 = sVar2 + 1;
    if (bVar3) {
      sVar2 = 0;
    }
  }
  return;
}

Assistant:

void AssignRange(InputIt first, InputIt last) {
    ClearRetainCapacity();
    if (std::is_base_of<
            std::random_access_iterator_tag,
            typename std::iterator_traits<InputIt>::iterator_category>::value) {
      reserve(std::distance(first, last));
    }
    for (; first != last; ++first) {
      emplace_back(*first);
    }
  }